

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getclosurename(HSQUIRRELVM v,SQInteger idx)

{
  HSQUIRRELVM this;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  SQRESULT local_8;
  
  this = (HSQUIRRELVM)stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  if ((*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0x8000200) ||
     (*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0x8000100)) {
    if (*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0x8000200) {
      SQVM::Push(this,in_stack_ffffffffffffffd8);
    }
    else {
      SQVM::Push(this,in_stack_ffffffffffffffd8);
    }
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(this,(SQChar *)in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_getclosurename(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    if(sq_isnativeclosure(o))
    {
        v->Push(_nativeclosure(o)->_name);
    }
    else { //closure
        v->Push(_closure(o)->_function->_name);
    }
    return SQ_OK;
}